

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O1

void __thiscall
BasicContainer::build
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list,
          treenode **cur)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  float fVar7;
  BasicContainer *this_00;
  treenode **pptVar8;
  uint uVar9;
  treenode *ptVar10;
  ulong uVar11;
  pointer ppBVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  __last;
  code *pcVar17;
  _Iter_comp_iter<bool_(*)(BasicPrimitive_*,_BasicPrimitive_*)> __comp;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  _Var18;
  long lVar19;
  float fVar20;
  double dVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  vector<float,_std::allocator<float>_> prefix_area;
  vector<float,_std::allocator<float>_> suffix_area;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  undefined8 local_b8;
  vector<float,_std::allocator<float>_> local_a8;
  BasicContainer *local_88;
  treenode **local_80;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_78;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_60;
  double local_48;
  double dStack_40;
  
  if (*cur == (treenode *)0x0) {
    ptVar10 = (treenode *)operator_new(0x30);
    ptVar10->lc = (treenode *)0x0;
    ptVar10->rc = (treenode *)0x0;
    ptVar10->shape = (BasicPrimitive *)0x0;
    (ptVar10->bound).x1 = 0.0;
    (ptVar10->bound).x2 = 0.0;
    (ptVar10->bound).y1 = 0.0;
    (ptVar10->bound).y2 = 0.0;
    (ptVar10->bound).z1 = 0.0;
    (ptVar10->bound).z2 = 0.0;
    *cur = ptVar10;
  }
  ppBVar12 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_start;
  if ((long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppBVar12 == 8) {
    (*cur)->shape = *ppBVar12;
    (*((*ppBVar12)->super_Primitive)._vptr_Primitive[1])(local_c8);
    ptVar10 = *cur;
    *(pointer *)&(ptVar10->bound).z1 = local_b8;
    (ptVar10->bound).x1 = (float)local_c8._0_4_;
    (ptVar10->bound).x2 = (float)local_c8._4_4_;
    *(pointer *)&(ptVar10->bound).y1 = uStack_c0;
  }
  else {
    ptVar10 = *cur;
    local_88 = this;
    local_80 = cur;
    (*((*ppBVar12)->super_Primitive)._vptr_Primitive[1])(local_c8);
    *(pointer *)&(ptVar10->bound).z1 = local_b8;
    (ptVar10->bound).x1 = (float)local_c8._0_4_;
    (ptVar10->bound).x2 = (float)local_c8._4_4_;
    *(pointer *)&(ptVar10->bound).y1 = uStack_c0;
    _Var18._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    uVar11 = (long)__last._M_current - (long)_Var18._M_current >> 3;
    if (1 < uVar11) {
      uVar16 = 1;
      do {
        (*(_Var18._M_current[uVar16]->super_Primitive)._vptr_Primitive[1])(local_c8);
        fVar20 = (ptVar10->bound).x1;
        fVar23 = (ptVar10->bound).x2;
        fVar24 = (float)local_c8._0_4_;
        if (fVar20 <= (float)local_c8._0_4_) {
          fVar24 = fVar20;
        }
        fVar25 = (float)local_c8._4_4_;
        if ((float)local_c8._4_4_ <= fVar23) {
          fVar25 = fVar23;
        }
        fVar26 = (ptVar10->bound).y1;
        fVar27 = (float)uStack_c0;
        if (fVar26 <= (float)uStack_c0) {
          fVar27 = fVar26;
        }
        fVar1 = (ptVar10->bound).y2;
        fVar2 = uStack_c0._4_4_;
        if (uStack_c0._4_4_ <= fVar1) {
          fVar2 = fVar1;
        }
        fVar3 = (ptVar10->bound).z1;
        fVar4 = (float)local_b8;
        if (fVar3 <= (float)local_b8) {
          fVar4 = fVar3;
        }
        fVar5 = (ptVar10->bound).z2;
        fVar7 = local_b8._4_4_;
        if (local_b8._4_4_ <= fVar5) {
          fVar7 = fVar5;
        }
        (ptVar10->bound).x1 =
             (float)(~-(uint)NAN(fVar20) & (uint)fVar24 | -(uint)NAN(fVar20) & local_c8._0_4_);
        (ptVar10->bound).x2 =
             (float)(~-(uint)NAN(fVar23) & (uint)fVar25 | -(uint)NAN(fVar23) & local_c8._4_4_);
        (ptVar10->bound).y1 =
             (float)(~-(uint)NAN(fVar26) & (uint)fVar27 |
                    -(uint)NAN(fVar26) & (uint)(float)uStack_c0);
        (ptVar10->bound).y2 =
             (float)(~-(uint)NAN(fVar1) & (uint)fVar2 | -(uint)NAN(fVar1) & (uint)uStack_c0._4_4_);
        (ptVar10->bound).z1 =
             (float)(~-(uint)NAN(fVar3) & (uint)fVar4 | -(uint)NAN(fVar3) & (uint)(float)local_b8);
        (ptVar10->bound).z2 =
             (float)(~-(uint)NAN(fVar5) & (uint)fVar7 | -(uint)NAN(fVar5) & (uint)local_b8._4_4_);
        uVar16 = uVar16 + 1;
        _Var18._M_current =
             (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_start;
        __last._M_current =
             (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        uVar11 = (long)__last._M_current - (long)_Var18._M_current >> 3;
      } while (uVar16 < uVar11);
    }
    if (_Var18._M_current != __last._M_current) {
      fVar20 = (ptVar10->bound).z2 - (ptVar10->bound).z1;
      fVar23 = (ptVar10->bound).x2 - (ptVar10->bound).x1;
      fVar24 = (ptVar10->bound).y2 - (ptVar10->bound).y1;
      pcVar17 = build::anon_class_1_0_00000001::__invoke;
      if (fVar23 < fVar24) {
        pcVar17 = build::anon_class_1_0_00000001::__invoke;
      }
      __comp._M_comp = build::anon_class_1_0_00000001::__invoke;
      if (fVar20 <= fVar23 || fVar20 <= fVar24) {
        __comp._M_comp = pcVar17;
      }
      lVar13 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(BasicPrimitive*,BasicPrimitive*)>>
                (_Var18,__last,(ulong)(((uint)lVar13 ^ 0x3f) * 2) ^ 0x7e,__comp);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(BasicPrimitive*,BasicPrimitive*)>>
                (_Var18,__last,__comp);
    }
    local_c8 = (undefined1  [8])0x0;
    uStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_c8,
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    std::vector<float,_std::allocator<float>_>::resize
              (&local_a8,
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    (*((*(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->super_Primitive)._vptr_Primitive[1])(&local_f8);
    ppBVar12 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar12;
    if (lVar13 != 0) {
      uVar11 = 0;
      do {
        (*(ppBVar12[uVar11]->super_Primitive)._vptr_Primitive[1])(&local_e0);
        fVar20 = local_e0;
        if (local_f8 <= local_e0) {
          fVar20 = local_f8;
        }
        fVar23 = (float)(~-(uint)NAN(local_f8) & (uint)fVar20 |
                        -(uint)NAN(local_f8) & (uint)local_e0);
        fVar20 = fStack_dc;
        if (fStack_dc <= fStack_f4) {
          fVar20 = fStack_f4;
        }
        fVar24 = (float)(~-(uint)NAN(fStack_f4) & (uint)fVar20 |
                        -(uint)NAN(fStack_f4) & (uint)fStack_dc);
        fVar20 = fStack_d8;
        if (fStack_f0 <= fStack_d8) {
          fVar20 = fStack_f0;
        }
        fVar25 = (float)(~-(uint)NAN(fStack_f0) & (uint)fVar20 |
                        -(uint)NAN(fStack_f0) & (uint)fStack_d8);
        fVar20 = fStack_d4;
        if (fStack_d4 <= fStack_ec) {
          fVar20 = fStack_ec;
        }
        fVar26 = (float)(~-(uint)NAN(fStack_ec) & (uint)fVar20 |
                        -(uint)NAN(fStack_ec) & (uint)fStack_d4);
        fVar20 = local_d0;
        if (local_e8 <= local_d0) {
          fVar20 = local_e8;
        }
        fVar27 = (float)(~-(uint)NAN(local_e8) & (uint)fVar20 |
                        -(uint)NAN(local_e8) & (uint)local_d0);
        fVar20 = fStack_cc;
        if (fStack_cc <= fStack_e4) {
          fVar20 = fStack_e4;
        }
        fVar20 = (float)(~-(uint)NAN(fStack_e4) & (uint)fVar20 |
                        -(uint)NAN(fStack_e4) & (uint)fStack_cc);
        _local_f8 = CONCAT44(fVar24,fVar23);
        _fStack_f0 = CONCAT44(fVar26,fVar25);
        _local_e8 = CONCAT44(fVar20,fVar27);
        fVar24 = fVar24 - fVar23;
        fVar26 = fVar26 - fVar25;
        fVar20 = fVar20 - fVar27;
        fVar20 = fVar20 * fVar26 + fVar24 * fVar26 + fVar24 * fVar20;
        *(float *)((long)local_c8 + uVar11 * 4) = fVar20 + fVar20;
        uVar11 = uVar11 + 1;
        ppBVar12 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)(list->
                       super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar12;
      } while (uVar11 < (ulong)(lVar13 >> 3));
    }
    (**(code **)(**(long **)((long)ppBVar12 + lVar13 + -8) + 8))(&local_e0);
    local_e8 = local_d0;
    fStack_e4 = fStack_cc;
    local_f8 = local_e0;
    fStack_f4 = fStack_dc;
    fStack_f0 = fStack_d8;
    fStack_ec = fStack_d4;
    uVar9 = (int)((ulong)((long)(list->
                                super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(list->
                               super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
    if (-1 < (int)uVar9) {
      lVar13 = (ulong)uVar9 + 1;
      do {
        (*((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar13 + -1]->super_Primitive)._vptr_Primitive[1])
                  (&local_e0);
        fVar20 = local_e0;
        if (local_f8 <= local_e0) {
          fVar20 = local_f8;
        }
        local_f8 = (float)(~-(uint)NAN(local_f8) & (uint)fVar20 |
                          -(uint)NAN(local_f8) & (uint)local_e0);
        fVar20 = fStack_dc;
        if (fStack_dc <= fStack_f4) {
          fVar20 = fStack_f4;
        }
        fStack_f4 = (float)(~-(uint)NAN(fStack_f4) & (uint)fVar20 |
                           -(uint)NAN(fStack_f4) & (uint)fStack_dc);
        fVar20 = fStack_d8;
        if (fStack_f0 <= fStack_d8) {
          fVar20 = fStack_f0;
        }
        fStack_f0 = (float)(~-(uint)NAN(fStack_f0) & (uint)fVar20 |
                           -(uint)NAN(fStack_f0) & (uint)fStack_d8);
        fVar20 = fStack_d4;
        if (fStack_d4 <= fStack_ec) {
          fVar20 = fStack_ec;
        }
        fStack_ec = (float)(~-(uint)NAN(fStack_ec) & (uint)fVar20 |
                           -(uint)NAN(fStack_ec) & (uint)fStack_d4);
        fVar20 = local_d0;
        if (local_e8 <= local_d0) {
          fVar20 = local_e8;
        }
        local_e8 = (float)(~-(uint)NAN(local_e8) & (uint)fVar20 |
                          -(uint)NAN(local_e8) & (uint)local_d0);
        fVar20 = fStack_cc;
        if (fStack_cc <= fStack_e4) {
          fVar20 = fStack_e4;
        }
        fStack_e4 = (float)(~-(uint)NAN(fStack_e4) & (uint)fVar20 |
                           -(uint)NAN(fStack_e4) & (uint)fStack_cc);
        fVar20 = (fStack_e4 - local_e8) * (fStack_ec - fStack_f0) +
                 (fStack_f4 - local_f8) * (fStack_ec - fStack_f0) +
                 (fStack_f4 - local_f8) * (fStack_e4 - local_e8);
        local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar13 + -1] = fVar20 + fVar20;
        lVar19 = lVar13 + -1;
        bVar6 = 0 < lVar13;
        lVar13 = lVar19;
      } while (lVar19 != 0 && bVar6);
    }
    _Var18._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    lVar13 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)_Var18._M_current;
    lVar19 = lVar13 >> 3;
    auVar22._8_4_ = (int)(lVar13 >> 0x23);
    auVar22._0_8_ = lVar19;
    auVar22._12_4_ = 0x45300000;
    dStack_40 = auVar22._8_8_ - 1.9342813113834067e+25;
    local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
    dVar21 = round(local_48 * 0.15);
    iVar14 = (int)dVar21;
    dVar21 = round(local_48 * 0.85);
    iVar15 = iVar14;
    if (iVar14 < (int)(dVar21 + -1.0)) {
      lVar13 = (long)iVar14;
      lVar19 = 0;
      do {
        if (*(float *)((long)local_c8 + (lVar13 + lVar19) * 4) +
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13 + lVar19 + 1] <
            *(float *)((long)local_c8 + (long)iVar15 * 4) +
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[(long)iVar15 + 1]) {
          iVar15 = iVar14 + (int)lVar19;
        }
        lVar19 = lVar19 + 1;
      } while ((int)(dVar21 + -1.0) - lVar13 != lVar19);
    }
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_60,_Var18,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(_Var18._M_current + (long)iVar15 + 1),(allocator_type *)&local_e0);
    pptVar8 = local_80;
    this_00 = local_88;
    build(local_88,&local_60,&(*local_80)->lc);
    if (local_60.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_78,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar15 + 1),
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_e0);
    build(this_00,&local_78,&(*pptVar8)->rc);
    if (local_78.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_c8);
    }
  }
  return;
}

Assistant:

void build(std::vector<BasicPrimitive*> list, treenode*& cur)
	{
		// create tree node
		if (!cur) {
			cur = new treenode();
		}
		// bind shape to leaf nodes
		if (list.size() == 1)
		{
			cur->shape = list[0];
			cur->bound = list[0]->boundingVolume();
			return;
		}
		// compute bounding box
		AABox& bound = cur->bound;
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
		// sort in sparsest dimension
		auto cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
			return a->boundingVolume().x1 < b->boundingVolume().x1;
		};
		if (bound.y2 - bound.y1 > bound.x2 - bound.x1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().y1 < b->boundingVolume().y1;
			};
		}
		if (bound.z2 - bound.z1 > bound.x2 - bound.x1 &&
			bound.z2 - bound.z1 > bound.y2 - bound.y1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().z1 < b->boundingVolume().z1;
			};
		}
		std::sort(list.begin(), list.end(), cmp);
		// determine split position to minimize sum of surface area of bounding boxes
		std::vector<float> prefix_area, suffix_area;
		prefix_area.resize(list.size());
		suffix_area.resize(list.size());
		AABox accu = list[0]->boundingVolume();
		for (int i=0; i<list.size(); ++i) {
			accu = accu + list[i]->boundingVolume();
			prefix_area[i] = accu.surfaceArea();
		}
		accu = list[list.size()-1]->boundingVolume();
		for (int i=list.size()-1; i>=0; --i) {
			accu = accu + list[i]->boundingVolume();
			suffix_area[i] = accu.surfaceArea();
		}
		int rangemin = round(list.size()*0.15);
		int rangemax = round(list.size()*0.85)-1;
		// limit split point from being too close to side
		int best = rangemin;
		for (int i=rangemin; i<rangemax; ++i) {
			if (prefix_area[i] + suffix_area[i+1] < prefix_area[best] + suffix_area[best+1])
				best = i;
		}
		// recursive partition
		build(std::vector<BasicPrimitive*>(list.begin(), list.begin()+best+1), cur->lc);
		build(std::vector<BasicPrimitive*>(list.begin()+best+1, list.end()), cur->rc);
	}